

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Metadata.cpp
# Opt level: O2

void __thiscall ASDCP::MXF::Identification::Dump(Identification *this,FILE *stream)

{
  char *pcVar1;
  undefined8 uVar2;
  char identbuf [128];
  char local_a8 [136];
  
  local_a8[0] = '\0';
  if (stream == (FILE *)0x0) {
    stream = (FILE *)_stderr;
  }
  InterchangeObject::Dump(&this->super_InterchangeObject,stream);
  pcVar1 = Kumu::UUID::EncodeString(&this->ThisGenerationUID,local_a8,0x80);
  fprintf((FILE *)stream,"  %22s = %s\n","ThisGenerationUID",pcVar1);
  pcVar1 = UTF16String::EncodeString(&this->CompanyName,local_a8,0x80);
  fprintf((FILE *)stream,"  %22s = %s\n","CompanyName",pcVar1);
  pcVar1 = UTF16String::EncodeString(&this->ProductName,local_a8,0x80);
  fprintf((FILE *)stream,"  %22s = %s\n","ProductName",pcVar1);
  pcVar1 = VersionType::EncodeString(&this->ProductVersion,local_a8,0x80);
  fprintf((FILE *)stream,"  %22s = %s\n","ProductVersion",pcVar1);
  pcVar1 = UTF16String::EncodeString(&this->VersionString,local_a8,0x80);
  fprintf((FILE *)stream,"  %22s = %s\n","VersionString",pcVar1);
  pcVar1 = Kumu::UUID::EncodeString(&this->ProductUID,local_a8,0x80);
  fprintf((FILE *)stream,"  %22s = %s\n","ProductUID",pcVar1);
  uVar2 = Kumu::Timestamp::EncodeString((char *)&this->ModificationDate,(uint)local_a8);
  fprintf((FILE *)stream,"  %22s = %s\n","ModificationDate",uVar2);
  pcVar1 = VersionType::EncodeString(&this->ToolkitVersion,local_a8,0x80);
  fprintf((FILE *)stream,"  %22s = %s\n","ToolkitVersion",pcVar1);
  if ((this->Platform).m_has_value == true) {
    pcVar1 = UTF16String::EncodeString(&(this->Platform).m_property,local_a8,0x80);
    fprintf((FILE *)stream,"  %22s = %s\n","Platform",pcVar1);
  }
  return;
}

Assistant:

void
Identification::Dump(FILE* stream)
{
  char identbuf[IdentBufferLen];
  *identbuf = 0;

  if ( stream == 0 )
    stream = stderr;

  InterchangeObject::Dump(stream);
  fprintf(stream, "  %22s = %s\n",  "ThisGenerationUID", ThisGenerationUID.EncodeString(identbuf, IdentBufferLen));
  fprintf(stream, "  %22s = %s\n",  "CompanyName", CompanyName.EncodeString(identbuf, IdentBufferLen));
  fprintf(stream, "  %22s = %s\n",  "ProductName", ProductName.EncodeString(identbuf, IdentBufferLen));
  fprintf(stream, "  %22s = %s\n",  "ProductVersion", ProductVersion.EncodeString(identbuf, IdentBufferLen));
  fprintf(stream, "  %22s = %s\n",  "VersionString", VersionString.EncodeString(identbuf, IdentBufferLen));
  fprintf(stream, "  %22s = %s\n",  "ProductUID", ProductUID.EncodeString(identbuf, IdentBufferLen));
  fprintf(stream, "  %22s = %s\n",  "ModificationDate", ModificationDate.EncodeString(identbuf, IdentBufferLen));
  fprintf(stream, "  %22s = %s\n",  "ToolkitVersion", ToolkitVersion.EncodeString(identbuf, IdentBufferLen));
  if ( ! Platform.empty() ) {
    fprintf(stream, "  %22s = %s\n",  "Platform", Platform.get().EncodeString(identbuf, IdentBufferLen));
  }
}